

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

bool __thiscall
flatbuffers::FlatCompiler::RegisterCodeGenerator
          (FlatCompiler *this,FlatCOption *option,
          shared_ptr<flatbuffers::CodeGenerator> *code_generator)

{
  string *__rhs;
  size_type sVar1;
  uint uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  size_type __n;
  size_type sVar7;
  char cVar8;
  ulong uVar9;
  _Rb_tree_node_base *p_Var10;
  bool bVar11;
  FlatCOption local_270;
  FlatCOption local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  FlatCOption local_130;
  FlatCOption local_b0;
  
  if ((option->short_opt)._M_string_length == 0) {
    bVar11 = false;
  }
  else {
    std::operator+(&local_150,"-",&option->short_opt);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_150);
    bVar11 = (_Rb_tree_header *)iVar3._M_node !=
             &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar11) {
    std::operator+(&local_270.short_opt,"multiple generators registered under: -",&option->short_opt
                  );
    (*(this->params_).error_fn)(this,&local_270.short_opt,false,false);
LAB_00304bef:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.short_opt._M_dataplus._M_p != &local_270.short_opt.field_2) {
      operator_delete(local_270.short_opt._M_dataplus._M_p,
                      local_270.short_opt.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if ((option->short_opt)._M_string_length != 0) {
    std::operator+(&local_270.short_opt,"-",&option->short_opt);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
             ::operator[](&this->code_generators_,&local_270.short_opt);
    (pmVar4->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (code_generator->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount,
               &(code_generator->
                super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.short_opt._M_dataplus._M_p != &local_270.short_opt.field_2) {
      operator_delete(local_270.short_opt._M_dataplus._M_p,
                      local_270.short_opt.field_2._M_allocated_capacity + 1);
    }
  }
  __rhs = &option->long_opt;
  if ((option->long_opt)._M_string_length == 0) {
    bVar11 = false;
  }
  else {
    std::operator+(&local_170,"--",__rhs);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
                    *)this,&local_170);
    bVar11 = (_Rb_tree_header *)iVar3._M_node !=
             &(this->code_generators_)._M_t._M_impl.super__Rb_tree_header;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar11) {
    std::operator+(&local_270.short_opt,"multiple generators registered under: --",__rhs);
    (*(this->params_).error_fn)(this,&local_270.short_opt,false,false);
    goto LAB_00304bef;
  }
  if ((option->long_opt)._M_string_length != 0) {
    std::operator+(&local_270.short_opt,"--",__rhs);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<flatbuffers::CodeGenerator>_>_>_>
             ::operator[](&this->code_generators_,&local_270.short_opt);
    (pmVar4->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (code_generator->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>
         )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount,
               &(code_generator->
                super___shared_ptr<flatbuffers::CodeGenerator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.short_opt._M_dataplus._M_p != &local_270.short_opt.field_2) {
      operator_delete(local_270.short_opt._M_dataplus._M_p,
                      local_270.short_opt.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var6 = (_Rb_tree_node_base *)language_options._16_8_;
  if (language_options._16_8_ == 0) {
    cVar8 = '\x01';
    p_Var10 = (_Rb_tree_node_base *)(language_options + 8);
  }
  else {
    do {
      p_Var10 = p_Var6;
      FlatCOption::FlatCOption(&local_270,option);
      FlatCOption::FlatCOption(&local_1f0,(FlatCOption *)(p_Var10 + 1));
      sVar1 = local_1f0.long_opt._M_string_length;
      sVar7 = local_270.long_opt._M_string_length;
      __n = local_270.long_opt._M_string_length;
      if (local_1f0.long_opt._M_string_length < local_270.long_opt._M_string_length) {
        __n = local_1f0.long_opt._M_string_length;
      }
      if (__n == 0) {
        uVar9 = 0;
      }
      else {
        uVar2 = memcmp(local_270.long_opt._M_dataplus._M_p,local_1f0.long_opt._M_dataplus._M_p,__n);
        uVar9 = (ulong)uVar2;
      }
      if ((int)uVar9 == 0) {
        uVar9 = sVar7 - sVar1;
        if ((long)uVar9 < -0x7fffffff) {
          uVar9 = 0xffffffff80000000;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0;
        }
        uVar9 = uVar9 & 0xffffffff;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.description._M_dataplus._M_p != &local_1f0.description.field_2) {
        operator_delete(local_1f0.description._M_dataplus._M_p,
                        local_1f0.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.parameter._M_dataplus._M_p != &local_1f0.parameter.field_2) {
        operator_delete(local_1f0.parameter._M_dataplus._M_p,
                        local_1f0.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.long_opt._M_dataplus._M_p != &local_1f0.long_opt.field_2) {
        operator_delete(local_1f0.long_opt._M_dataplus._M_p,
                        local_1f0.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.short_opt._M_dataplus._M_p != &local_1f0.short_opt.field_2) {
        operator_delete(local_1f0.short_opt._M_dataplus._M_p,
                        local_1f0.short_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.description._M_dataplus._M_p != &local_270.description.field_2) {
        operator_delete(local_270.description._M_dataplus._M_p,
                        local_270.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.parameter._M_dataplus._M_p != &local_270.parameter.field_2) {
        operator_delete(local_270.parameter._M_dataplus._M_p,
                        local_270.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.long_opt._M_dataplus._M_p != &local_270.long_opt.field_2) {
        operator_delete(local_270.long_opt._M_dataplus._M_p,
                        local_270.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.short_opt._M_dataplus._M_p != &local_270.short_opt.field_2) {
        operator_delete(local_270.short_opt._M_dataplus._M_p,
                        local_270.short_opt.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (&p_Var10->_M_left)[~(uint)uVar9 >> 0x1f];
    } while (p_Var6 != (_Rb_tree_node_base *)0x0);
    cVar8 = (char)(uVar9 >> 0x1f);
  }
  p_Var5 = p_Var10;
  if (cVar8 != '\0') {
    if (p_Var10 == (_Rb_tree_node_base *)language_options._24_8_) goto LAB_00304ff2;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var10);
  }
  FlatCOption::FlatCOption(&local_130,(FlatCOption *)(p_Var5 + 1));
  FlatCOption::FlatCOption(&local_b0,option);
  sVar7 = local_130.long_opt._M_string_length;
  if (local_b0.long_opt._M_string_length < local_130.long_opt._M_string_length) {
    sVar7 = local_b0.long_opt._M_string_length;
  }
  if (sVar7 == 0) {
    uVar9 = 0;
  }
  else {
    uVar2 = memcmp(local_130.long_opt._M_dataplus._M_p,local_b0.long_opt._M_dataplus._M_p,sVar7);
    uVar9 = (ulong)uVar2;
  }
  if ((int)uVar9 == 0) {
    uVar9 = 0xffffffff80000000;
    if (-0x80000000 <
        (long)(local_130.long_opt._M_string_length - local_b0.long_opt._M_string_length)) {
      uVar9 = local_130.long_opt._M_string_length - local_b0.long_opt._M_string_length;
    }
    if (0x7ffffffe < (long)uVar9) {
      uVar9 = 0x7fffffff;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.description._M_dataplus._M_p != &local_b0.description.field_2) {
    operator_delete(local_b0.description._M_dataplus._M_p,
                    local_b0.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.parameter._M_dataplus._M_p != &local_b0.parameter.field_2) {
    operator_delete(local_b0.parameter._M_dataplus._M_p,
                    local_b0.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.long_opt._M_dataplus._M_p != &local_b0.long_opt.field_2) {
    operator_delete(local_b0.long_opt._M_dataplus._M_p,
                    local_b0.long_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.short_opt._M_dataplus._M_p != &local_b0.short_opt.field_2) {
    operator_delete(local_b0.short_opt._M_dataplus._M_p,
                    local_b0.short_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.description._M_dataplus._M_p != &local_130.description.field_2) {
    operator_delete(local_130.description._M_dataplus._M_p,
                    local_130.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.parameter._M_dataplus._M_p != &local_130.parameter.field_2) {
    operator_delete(local_130.parameter._M_dataplus._M_p,
                    local_130.parameter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.long_opt._M_dataplus._M_p != &local_130.long_opt.field_2) {
    operator_delete(local_130.long_opt._M_dataplus._M_p,
                    local_130.long_opt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.short_opt._M_dataplus._M_p != &local_130.short_opt.field_2) {
    operator_delete(local_130.short_opt._M_dataplus._M_p,
                    local_130.short_opt.field_2._M_allocated_capacity + 1);
  }
  if (-1 < (int)uVar9) {
    p_Var6 = p_Var5;
    p_Var10 = (_Rb_tree_node_base *)0x0;
  }
LAB_00304ff2:
  if (p_Var10 != (_Rb_tree_node_base *)0x0) {
    bVar11 = true;
    if (p_Var10 != (_Rb_tree_node_base *)(language_options + 8) &&
        p_Var6 == (_Rb_tree_node_base *)0x0) {
      FlatCOption::FlatCOption(&local_270,option);
      FlatCOption::FlatCOption(&local_1f0,(FlatCOption *)(p_Var10 + 1));
      sVar7 = local_270.long_opt._M_string_length;
      if (local_1f0.long_opt._M_string_length < local_270.long_opt._M_string_length) {
        sVar7 = local_1f0.long_opt._M_string_length;
      }
      if (sVar7 == 0) {
        uVar9 = 0;
      }
      else {
        uVar2 = memcmp(local_270.long_opt._M_dataplus._M_p,local_1f0.long_opt._M_dataplus._M_p,sVar7
                      );
        uVar9 = (ulong)uVar2;
      }
      if ((int)uVar9 == 0) {
        uVar9 = 0xffffffff80000000;
        if (-0x80000000 <
            (long)(local_270.long_opt._M_string_length - local_1f0.long_opt._M_string_length)) {
          uVar9 = local_270.long_opt._M_string_length - local_1f0.long_opt._M_string_length;
        }
        if (0x7ffffffe < (long)uVar9) {
          uVar9 = 0;
        }
      }
      bVar11 = (bool)((byte)(uVar9 >> 0x1f) & 1);
    }
    if (p_Var10 != (_Rb_tree_node_base *)(language_options + 8) &&
        p_Var6 == (_Rb_tree_node_base *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.description._M_dataplus._M_p != &local_1f0.description.field_2) {
        operator_delete(local_1f0.description._M_dataplus._M_p,
                        local_1f0.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.parameter._M_dataplus._M_p != &local_1f0.parameter.field_2) {
        operator_delete(local_1f0.parameter._M_dataplus._M_p,
                        local_1f0.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.long_opt._M_dataplus._M_p != &local_1f0.long_opt.field_2) {
        operator_delete(local_1f0.long_opt._M_dataplus._M_p,
                        local_1f0.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.short_opt._M_dataplus._M_p != &local_1f0.short_opt.field_2) {
        operator_delete(local_1f0.short_opt._M_dataplus._M_p,
                        local_1f0.short_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.description._M_dataplus._M_p != &local_270.description.field_2) {
        operator_delete(local_270.description._M_dataplus._M_p,
                        local_270.description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.parameter._M_dataplus._M_p != &local_270.parameter.field_2) {
        operator_delete(local_270.parameter._M_dataplus._M_p,
                        local_270.parameter.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.long_opt._M_dataplus._M_p != &local_270.long_opt.field_2) {
        operator_delete(local_270.long_opt._M_dataplus._M_p,
                        local_270.long_opt.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270.short_opt._M_dataplus._M_p != &local_270.short_opt.field_2) {
        operator_delete(local_270.short_opt._M_dataplus._M_p,
                        local_270.short_opt.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var6 = (_Rb_tree_node_base *)operator_new(0xa0);
    FlatCOption::FlatCOption((FlatCOption *)(p_Var6 + 1),option);
    std::_Rb_tree_insert_and_rebalance
              (bVar11,p_Var6,p_Var10,(_Rb_tree_node_base *)(language_options + 8));
    language_options._40_8_ = language_options._40_8_ + 1;
  }
  return true;
}

Assistant:

bool FlatCompiler::RegisterCodeGenerator(
    const FlatCOption &option, std::shared_ptr<CodeGenerator> code_generator) {
  if (!option.short_opt.empty() &&
      code_generators_.find("-" + option.short_opt) != code_generators_.end()) {
    Error("multiple generators registered under: -" + option.short_opt, false,
          false);
    return false;
  }

  if (!option.short_opt.empty()) {
    code_generators_["-" + option.short_opt] = code_generator;
  }

  if (!option.long_opt.empty() &&
      code_generators_.find("--" + option.long_opt) != code_generators_.end()) {
    Error("multiple generators registered under: --" + option.long_opt, false,
          false);
    return false;
  }

  if (!option.long_opt.empty()) {
    code_generators_["--" + option.long_opt] = code_generator;
  }

  language_options.insert(option);

  return true;
}